

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

uint __thiscall
xercesc_4_0::WFElemStack::mapPrefixToURI(WFElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  uint uVar1;
  int local_3c;
  int mapIndex;
  StackElem *curRow;
  uint prefixId;
  bool *unknown_local;
  XMLCh *prefixToMap_local;
  WFElemStack *this_local;
  
  *unknown = false;
  uVar1 = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  if (uVar1 == 0) {
    *unknown = true;
    this_local._4_4_ = this->fUnknownNamespaceId;
  }
  else if (uVar1 == this->fXMLPoolId) {
    this_local._4_4_ = this->fXMLNamespaceId;
  }
  else if (uVar1 == this->fXMLNSPoolId) {
    this_local._4_4_ = this->fXMLNSNamespaceId;
  }
  else {
    for (local_3c = this->fStack[this->fStackTop - 1]->fTopPrefix; -1 < local_3c;
        local_3c = local_3c + -1) {
      if (this->fMap[local_3c].fPrefId == uVar1) {
        return this->fMap[local_3c].fURIId;
      }
    }
    if (*prefixToMap == L'\0') {
      this_local._4_4_ = this->fEmptyNamespaceId;
    }
    else {
      *unknown = true;
      this_local._4_4_ = this->fUnknownNamespaceId;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int WFElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                          ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);
    if (!prefixId)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }

    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    //  Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];
    for (int mapIndex = curRow->fTopPrefix; mapIndex >=0; mapIndex--)
    {
        if (fMap[mapIndex].fPrefId == prefixId)
            return fMap[mapIndex].fURIId;
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}